

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

void Abc_CountZddCubes_rec(DdManager *dd,DdNode *zCover,int *pnCubes)

{
  DdNode *zC2;
  DdNode *zC1;
  DdNode *zC0;
  DdNode *local_40;
  DdNode *local_38;
  DdNode *local_30;
  
  if (dd->zero != zCover) {
    if (dd->one == zCover) {
      *pnCubes = *pnCubes + 1;
    }
    else if (*pnCubes < 0x186a1) {
      extraDecomposeCover(dd,zCover,&local_30,&local_38,&local_40);
      Abc_CountZddCubes_rec(dd,local_30,pnCubes);
      Abc_CountZddCubes_rec(dd,local_38,pnCubes);
      Abc_CountZddCubes_rec(dd,local_40,pnCubes);
    }
  }
  return;
}

Assistant:

void Abc_CountZddCubes_rec( DdManager * dd, DdNode * zCover, int * pnCubes )
{
    DdNode * zC0, * zC1, * zC2;
    if ( zCover == dd->zero )
        return;
    if ( zCover == dd->one )
    {
        (*pnCubes)++;
        return;
    }
    if ( (*pnCubes) > ABC_MAX_CUBES )
        return;
    extraDecomposeCover( dd, zCover, &zC0, &zC1, &zC2 );
    Abc_CountZddCubes_rec( dd, zC0, pnCubes );
    Abc_CountZddCubes_rec( dd, zC1, pnCubes );
    Abc_CountZddCubes_rec( dd, zC2, pnCubes );
}